

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply_sdf.cpp
# Opt level: O3

void sdf_tools::evaluateAtGridPoints(Sdf *sdf,Grid *grid)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pfVar5;
  float extraout_XMM0_Da;
  int3 iVar6;
  real3 rVar7;
  real3 rVar8;
  ulong local_c8;
  pointer local_b0;
  int local_90;
  float local_88;
  
  iVar6 = Grid::getDimensions(grid);
  rVar7 = Grid::getSpacing(grid);
  rVar8 = Grid::getOffsets(grid);
  local_88 = rVar7.x;
  if (0 < iVar6.z) {
    local_b0 = (grid->field).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    uVar3 = iVar6._0_8_ >> 0x20;
    uVar2 = iVar6._0_8_ & 0xffffffff;
    local_c8 = 0;
    do {
      if (0 < iVar6.y) {
        uVar4 = 0;
        pfVar5 = local_b0;
        do {
          local_90 = iVar6.x;
          if (0 < local_90) {
            uVar1 = 0;
            do {
              (*sdf->_vptr_Sdf[2])
                        ((float)(int)uVar1 * local_88 + rVar8.x,
                         (float)(int)local_c8 * rVar7.z + rVar8.z,sdf);
              pfVar5[uVar1] = extraout_XMM0_Da;
              uVar1 = uVar1 + 1;
            } while (uVar2 != uVar1);
          }
          uVar4 = uVar4 + 1;
          pfVar5 = pfVar5 + uVar2;
        } while (uVar4 != uVar3);
      }
      local_c8 = local_c8 + 1;
      local_b0 = local_b0 + uVar3 * uVar2;
    } while (local_c8 != (uint)iVar6.z);
  }
  return;
}

Assistant:

void evaluateAtGridPoints(const sdf::Sdf *sdf, Grid *grid)
{
    auto applySdf = [sdf](real3 r, real& gridValue) {gridValue = sdf->at(r);};
    gridForEachPoint(applySdf, grid);
}